

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O1

void __thiscall irr::scene::CAnimatedMeshSceneNode::beginTransition(CAnimatedMeshSceneNode *this)

{
  pointer *ppCVar1;
  iterator __position;
  pointer pCVar2;
  pointer ppIVar3;
  u32 n;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  CMatrix4<float> local_68;
  
  if (this->JointsUsed == true) {
    if (this->TransitionTime != 0) {
      uVar5 = (ulong)((long)(this->PretransitingSave).m_data.
                            super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->PretransitingSave).m_data.
                           super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
      if (((uint)uVar5 <
           (uint)((ulong)((long)(this->JointChildSceneNodes).m_data.
                                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->JointChildSceneNodes).m_data.
                               super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
         ((uint)uVar5 <
          (uint)((ulong)((long)(this->JointChildSceneNodes).m_data.
                               super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->JointChildSceneNodes).m_data.
                              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
        do {
          local_68.M[0xc] = 0.0;
          local_68.M[0xd] = 0.0;
          local_68.M[8] = 0.0;
          local_68.M[9] = 0.0;
          local_68.M[6] = 0.0;
          local_68.M[7] = 0.0;
          local_68.M[2] = 0.0;
          local_68.M[3] = 0.0;
          local_68.M[0xe] = 0.0;
          local_68.M[0xf] = 1.0;
          local_68.M[10] = 1.0;
          local_68.M[0xb] = 0.0;
          local_68.M[4] = 0.0;
          local_68.M[5] = 1.0;
          local_68.M[0] = 1.0;
          local_68.M[1] = 0.0;
          __position._M_current =
               (this->PretransitingSave).m_data.
               super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->PretransitingSave).m_data.
              super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<irr::core::CMatrix4<float>,std::allocator<irr::core::CMatrix4<float>>>::
            _M_realloc_insert<irr::core::CMatrix4<float>>
                      ((vector<irr::core::CMatrix4<float>,std::allocator<irr::core::CMatrix4<float>>>
                        *)&this->PretransitingSave,__position,&local_68);
          }
          else {
            (__position._M_current)->M[0xc] = 0.0;
            (__position._M_current)->M[0xd] = 0.0;
            (__position._M_current)->M[0xe] = 0.0;
            (__position._M_current)->M[0xf] = 1.0;
            (__position._M_current)->M[8] = 0.0;
            (__position._M_current)->M[9] = 0.0;
            (__position._M_current)->M[10] = 1.0;
            (__position._M_current)->M[0xb] = 0.0;
            (__position._M_current)->M[4] = 0.0;
            (__position._M_current)->M[5] = 1.0;
            (__position._M_current)->M[6] = 0.0;
            (__position._M_current)->M[7] = 0.0;
            (__position._M_current)->M[0] = 1.0;
            (__position._M_current)->M[1] = 0.0;
            (__position._M_current)->M[2] = 0.0;
            (__position._M_current)->M[3] = 0.0;
            ppCVar1 = &(this->PretransitingSave).m_data.
                       super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          (this->PretransitingSave).is_sorted = false;
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
        } while (uVar4 < (uint)((ulong)((long)(this->JointChildSceneNodes).m_data.
                                              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->JointChildSceneNodes).m_data.
                                             super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      ppIVar3 = (this->JointChildSceneNodes).m_data.
                super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->JointChildSceneNodes).m_data.
                              super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3) != 0
         ) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          (**(code **)(**(long **)((long)ppIVar3 + lVar6) + 0x58))(&local_68);
          pCVar2 = (this->PretransitingSave).m_data.
                   super__Vector_base<irr::core::CMatrix4<float>,_std::allocator<irr::core::CMatrix4<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 0xc) = local_68.M._48_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 0xc + 2) = local_68.M._56_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 8) = local_68.M._32_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 8 + 2) = local_68.M._40_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 4) = local_68.M._16_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2U + 4 + 2) = local_68.M._24_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2) = local_68.M._0_8_;
          *(undefined8 *)(pCVar2->M + lVar6 * 2 + 2) = local_68.M._8_8_;
          uVar5 = uVar5 + 1;
          ppIVar3 = (this->JointChildSceneNodes).m_data.
                    super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 8;
        } while (uVar5 < ((ulong)((long)(this->JointChildSceneNodes).m_data.
                                        super__Vector_base<irr::scene::IBoneSceneNode_*,_std::allocator<irr::scene::IBoneSceneNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3)
                          >> 3 & 0xffffffff));
      }
      this->Transiting = (f32)(1.0 / (float)this->TransitionTime);
    }
    this->TransitingBlend = 0.0;
  }
  return;
}

Assistant:

void CAnimatedMeshSceneNode::beginTransition()
{
	if (!JointsUsed)
		return;

	if (TransitionTime != 0) {
		// Check the array is big enough
		if (PretransitingSave.size() < JointChildSceneNodes.size()) {
			for (u32 n = PretransitingSave.size(); n < JointChildSceneNodes.size(); ++n)
				PretransitingSave.push_back(core::matrix4());
		}

		// Copy the position of joints
		for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
			PretransitingSave[n] = JointChildSceneNodes[n]->getRelativeTransformation();

		Transiting = core::reciprocal((f32)TransitionTime);
	}
	TransitingBlend = 0.f;
}